

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O3

void aom_lpf_horizontal_14_sse2(uchar *s,int p,uchar *_blimit,uchar *_limit,uchar *_thresh)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  byte bVar12;
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  byte bVar67;
  byte bVar68;
  byte bVar69;
  byte bVar70;
  byte bVar71;
  byte bVar72;
  byte bVar73;
  byte bVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [15];
  unkuint9 Var77;
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  unkuint9 Var80;
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  unkuint9 Var83;
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  unkuint9 Var86;
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [11];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [11];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  long lVar103;
  byte bVar104;
  byte bVar108;
  byte bVar110;
  byte bVar112;
  char cVar114;
  char cVar115;
  char cVar116;
  char cVar117;
  byte bVar118;
  byte bVar119;
  byte bVar120;
  byte bVar121;
  undefined1 auVar105 [16];
  char cVar109;
  char cVar111;
  char cVar113;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  short sVar123;
  short sVar124;
  short sVar125;
  short sVar126;
  short sVar127;
  short sVar128;
  short sVar129;
  undefined1 auVar122 [16];
  short sVar132;
  short sVar133;
  short sVar134;
  short sVar135;
  undefined4 uVar136;
  short sVar137;
  short sVar138;
  ushort uVar139;
  short sVar140;
  short sVar141;
  short sVar142;
  short sVar143;
  short sVar144;
  short sVar145;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  short sVar146;
  short sVar151;
  short sVar153;
  short sVar154;
  short sVar155;
  ulong uVar147;
  short sVar150;
  short sVar152;
  short sVar156;
  short sVar157;
  short sVar158;
  short sVar159;
  short sVar160;
  short sVar161;
  undefined1 auVar148 [16];
  short sVar162;
  short sVar163;
  ushort uVar164;
  ushort uVar166;
  ushort uVar167;
  undefined1 auVar165 [16];
  short sVar168;
  ushort uVar169;
  short sVar170;
  short sVar171;
  short sVar172;
  short sVar174;
  short sVar175;
  short sVar176;
  short sVar177;
  short sVar178;
  short sVar179;
  short sVar180;
  short sVar181;
  short sVar182;
  undefined1 auVar173 [16];
  short sVar183;
  short sVar184;
  short sVar185;
  short sVar186;
  short sVar187;
  short sVar188;
  short sVar189;
  short sVar192;
  short sVar193;
  short sVar194;
  short sVar195;
  short sVar196;
  short sVar197;
  short sVar198;
  short sVar199;
  short sVar200;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  short sVar201;
  uint uVar202;
  undefined4 uVar203;
  short sVar205;
  short sVar206;
  undefined4 uVar207;
  short sVar208;
  short sVar209;
  ushort uVar210;
  short sVar211;
  ushort uVar212;
  short sVar213;
  ushort uVar214;
  undefined1 auVar204 [16];
  ushort uVar215;
  byte bVar216;
  byte bVar217;
  short sVar218;
  short sVar219;
  short sVar220;
  byte bVar222;
  byte bVar223;
  short sVar224;
  short sVar225;
  short sVar226;
  byte bVar227;
  byte bVar228;
  byte bVar229;
  byte bVar230;
  byte bVar231;
  short sVar232;
  short sVar233;
  short sVar234;
  byte bVar235;
  byte bVar236;
  byte bVar237;
  short sVar238;
  short sVar239;
  short sVar240;
  short sVar241;
  byte bVar242;
  byte bVar243;
  byte bVar244;
  byte bVar245;
  byte bVar246;
  byte bVar247;
  byte bVar248;
  byte bVar249;
  byte bVar250;
  byte bVar251;
  byte bVar252;
  byte bVar253;
  byte bVar254;
  undefined1 auVar221 [16];
  ulong uVar255;
  undefined1 auVar256 [16];
  ushort uVar257;
  short sVar259;
  byte bVar260;
  short sVar261;
  byte bVar262;
  byte bVar264;
  short sVar263;
  byte bVar265;
  byte bVar267;
  short sVar266;
  byte bVar268;
  byte bVar270;
  short sVar269;
  byte bVar271;
  byte bVar273;
  short sVar272;
  byte bVar274;
  undefined1 auVar258 [16];
  byte bVar276;
  ushort uVar275;
  ushort uVar277;
  ushort uVar300;
  ulong uVar278;
  ushort uVar295;
  ushort uVar297;
  ushort uVar302;
  ushort uVar303;
  ushort uVar304;
  undefined1 auVar279 [16];
  undefined1 auVar288 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  ushort uVar305;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  ulong local_128;
  undefined1 local_118 [16];
  undefined1 auVar149 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar289 [16];
  undefined1 auVar292 [16];
  undefined1 uVar293;
  undefined1 uVar294;
  undefined1 uVar296;
  undefined1 uVar298;
  undefined1 uVar299;
  undefined1 uVar301;
  
  lVar103 = (long)p;
  uVar1 = *(undefined4 *)(s + lVar103 * -5);
  uVar2 = *(undefined4 *)(s + lVar103 * -4);
  uVar3 = *(undefined4 *)(s + lVar103 * 3);
  auVar306._0_8_ = CONCAT44(uVar3,uVar2);
  auVar306._8_8_ = 0;
  uVar4 = *(undefined4 *)(s + lVar103 * -3);
  uVar5 = *(undefined4 *)(s + lVar103 * 2);
  auVar307._0_8_ = CONCAT44(uVar5,uVar4);
  auVar307._8_8_ = 0;
  uVar6 = *(undefined4 *)(s + lVar103 * -2);
  uVar7 = *(undefined4 *)(s + -lVar103);
  uVar8 = *(undefined4 *)(s + lVar103 * -6);
  uVar9 = *(undefined4 *)(s + lVar103);
  auVar165._0_8_ = CONCAT44(uVar9,uVar6);
  auVar165._8_8_ = 0;
  uVar10 = *(undefined4 *)s;
  auVar256._0_8_ = CONCAT44(uVar10,uVar7);
  auVar256._8_8_ = 0;
  auVar149._8_4_ = uVar10;
  auVar149._0_8_ = auVar256._0_8_;
  auVar149._12_4_ = uVar9;
  auVar148._8_8_ = auVar149._8_8_;
  auVar148._4_4_ = uVar6;
  auVar148._0_4_ = uVar7;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = auVar148._8_8_;
  auVar105 = psubusb(auVar148,auVar173);
  auVar130 = psubusb(auVar173,auVar148);
  auVar130 = auVar130 | auVar105;
  auVar131 = paddusb(auVar130,auVar130);
  auVar105._0_2_ = auVar130._4_2_ >> 1;
  auVar105._2_2_ = auVar130._6_2_ >> 1;
  auVar105._4_2_ = auVar130._8_2_ >> 1;
  auVar105._6_2_ = auVar130._10_2_ >> 1;
  auVar105._8_2_ = auVar130._12_2_ >> 1;
  auVar105._10_2_ = auVar130._14_2_ >> 1;
  auVar105._12_4_ = 0;
  auVar105 = paddusb(auVar105 & _DAT_004c8250,auVar131);
  auVar105 = psubusb(auVar105,*(undefined1 (*) [16])_blimit);
  bVar67 = *_thresh;
  bVar68 = _thresh[1];
  bVar69 = _thresh[2];
  bVar70 = _thresh[3];
  bVar71 = _thresh[4];
  bVar72 = _thresh[5];
  bVar73 = _thresh[6];
  bVar74 = _thresh[7];
  auVar130 = psubusb(auVar165,auVar256);
  auVar131 = psubusb(auVar256,auVar165);
  auVar131 = auVar131 | auVar130;
  bVar248 = -(auVar105[0] == '\0') ^ 0xff;
  bVar250 = -(auVar105[1] == '\0') ^ 0xff;
  bVar252 = -(auVar105[2] == '\0') ^ 0xff;
  bVar254 = -(auVar105[3] == '\0') ^ 0xff;
  bVar228 = -(auVar105[4] == '\0') ^ 0xff;
  bVar231 = -(auVar105[5] == '\0') ^ 0xff;
  bVar236 = -(auVar105[6] == '\0') ^ 0xff;
  bVar217 = -(auVar105[7] == '\0') ^ 0xff;
  bVar260 = auVar131[0];
  bVar104 = (bVar248 < bVar260) * bVar260 | (bVar248 >= bVar260) * bVar248;
  bVar262 = auVar131[1];
  bVar108 = (bVar250 < bVar262) * bVar262 | (bVar250 >= bVar262) * bVar250;
  bVar264 = auVar131[2];
  bVar110 = (bVar252 < bVar264) * bVar264 | (bVar252 >= bVar264) * bVar252;
  bVar265 = auVar131[3];
  bVar112 = (bVar254 < bVar265) * bVar265 | (bVar254 >= bVar265) * bVar254;
  bVar267 = auVar131[4];
  bVar230 = (bVar267 != 0) * bVar267;
  bVar268 = auVar131[5];
  bVar248 = (bVar268 != 0) * bVar268;
  bVar270 = auVar131[6];
  bVar250 = (bVar270 != 0) * bVar270;
  bVar271 = auVar131[7];
  bVar252 = (bVar271 != 0) * bVar271;
  bVar273 = auVar131[8];
  bVar118 = (bVar228 < bVar273) * bVar273 | (bVar228 >= bVar273) * bVar228;
  bVar274 = auVar131[9];
  bVar119 = (bVar231 < bVar274) * bVar274 | (bVar231 >= bVar274) * bVar231;
  bVar276 = auVar131[10];
  bVar120 = (bVar236 < bVar276) * bVar276 | (bVar236 >= bVar276) * bVar236;
  bVar12 = auVar131[0xb];
  bVar121 = (bVar217 < bVar12) * bVar12 | (bVar217 >= bVar12) * bVar217;
  bVar254 = (auVar131[0xc] != '\0') * auVar131[0xc];
  bVar228 = (auVar131[0xd] != '\0') * auVar131[0xd];
  bVar231 = (auVar131[0xe] != '\0') * auVar131[0xe];
  bVar236 = (auVar131[0xf] != '\0') * auVar131[0xf];
  auVar105 = psubusb(auVar307,auVar165);
  auVar130 = psubusb(auVar165,auVar307);
  auVar130 = auVar130 | auVar105;
  auVar105 = psubusb(auVar306,auVar307);
  auVar131 = psubusb(auVar307,auVar306);
  auVar131 = auVar131 | auVar105;
  bVar217 = auVar130[0];
  bVar216 = auVar131[0];
  bVar216 = (bVar216 < bVar217) * bVar217 | (bVar216 >= bVar217) * bVar216;
  bVar217 = auVar130[1];
  bVar222 = auVar131[1];
  bVar222 = (bVar222 < bVar217) * bVar217 | (bVar222 >= bVar217) * bVar222;
  bVar217 = auVar130[2];
  bVar223 = auVar131[2];
  bVar223 = (bVar223 < bVar217) * bVar217 | (bVar223 >= bVar217) * bVar223;
  bVar217 = auVar130[3];
  bVar227 = auVar131[3];
  bVar227 = (bVar227 < bVar217) * bVar217 | (bVar227 >= bVar217) * bVar227;
  bVar217 = auVar130[4];
  bVar229 = auVar131[4];
  bVar229 = (bVar229 < bVar217) * bVar217 | (bVar229 >= bVar217) * bVar229;
  bVar217 = auVar130[5];
  bVar235 = auVar131[5];
  bVar235 = (bVar235 < bVar217) * bVar217 | (bVar235 >= bVar217) * bVar235;
  bVar217 = auVar130[6];
  bVar237 = auVar131[6];
  bVar237 = (bVar237 < bVar217) * bVar217 | (bVar237 >= bVar217) * bVar237;
  bVar217 = auVar130[7];
  bVar242 = auVar131[7];
  bVar242 = (bVar242 < bVar217) * bVar217 | (bVar242 >= bVar217) * bVar242;
  bVar217 = auVar130[8];
  bVar243 = auVar131[8];
  bVar243 = (bVar243 < bVar217) * bVar217 | (bVar243 >= bVar217) * bVar243;
  bVar217 = auVar130[9];
  bVar244 = auVar131[9];
  bVar244 = (bVar244 < bVar217) * bVar217 | (bVar244 >= bVar217) * bVar244;
  bVar217 = auVar130[10];
  bVar245 = auVar131[10];
  bVar245 = (bVar245 < bVar217) * bVar217 | (bVar245 >= bVar217) * bVar245;
  bVar217 = auVar130[0xb];
  bVar246 = auVar131[0xb];
  bVar246 = (bVar246 < bVar217) * bVar217 | (bVar246 >= bVar217) * bVar246;
  bVar217 = auVar130[0xc];
  bVar247 = auVar131[0xc];
  bVar247 = (bVar247 < bVar217) * bVar217 | (bVar247 >= bVar217) * bVar247;
  bVar217 = auVar130[0xd];
  bVar249 = auVar131[0xd];
  bVar249 = (bVar249 < bVar217) * bVar217 | (bVar249 >= bVar217) * bVar249;
  bVar217 = auVar130[0xe];
  bVar251 = auVar131[0xe];
  bVar253 = auVar131[0xf];
  bVar251 = (bVar251 < bVar217) * bVar217 | (bVar251 >= bVar217) * bVar251;
  bVar217 = auVar130[0xf];
  bVar253 = (bVar253 < bVar217) * bVar217 | (bVar253 >= bVar217) * bVar253;
  bVar217 = (bVar216 < bVar104) * bVar104 | (bVar216 >= bVar104) * bVar216;
  bVar104 = (bVar222 < bVar108) * bVar108 | (bVar222 >= bVar108) * bVar222;
  bVar108 = (bVar223 < bVar110) * bVar110 | (bVar223 >= bVar110) * bVar223;
  bVar110 = (bVar227 < bVar112) * bVar112 | (bVar227 >= bVar112) * bVar227;
  bVar230 = (bVar229 < bVar230) * bVar230 | (bVar229 >= bVar230) * bVar229;
  bVar112 = (bVar235 < bVar248) * bVar248 | (bVar235 >= bVar248) * bVar235;
  bVar216 = (bVar237 < bVar250) * bVar250 | (bVar237 >= bVar250) * bVar237;
  bVar222 = (bVar242 < bVar252) * bVar252 | (bVar242 >= bVar252) * bVar242;
  bVar118 = (bVar243 < bVar118) * bVar118 | (bVar243 >= bVar118) * bVar243;
  bVar119 = (bVar244 < bVar119) * bVar119 | (bVar244 >= bVar119) * bVar244;
  bVar120 = (bVar245 < bVar120) * bVar120 | (bVar245 >= bVar120) * bVar245;
  bVar121 = (bVar246 < bVar121) * bVar121 | (bVar246 >= bVar121) * bVar246;
  bVar248 = (bVar247 < bVar254) * bVar254 | (bVar247 >= bVar254) * bVar247;
  bVar250 = (bVar249 < bVar228) * bVar228 | (bVar249 >= bVar228) * bVar249;
  bVar252 = (bVar251 < bVar231) * bVar231 | (bVar251 >= bVar231) * bVar251;
  bVar254 = (bVar253 < bVar236) * bVar236 | (bVar253 >= bVar236) * bVar253;
  bVar227 = (bVar230 < bVar217) * bVar217 | (bVar230 >= bVar217) * bVar230;
  bVar229 = (bVar112 < bVar104) * bVar104 | (bVar112 >= bVar104) * bVar112;
  bVar235 = (bVar216 < bVar108) * bVar108 | (bVar216 >= bVar108) * bVar216;
  bVar237 = (bVar222 < bVar110) * bVar110 | (bVar222 >= bVar110) * bVar222;
  bVar242 = (bVar118 < bVar230) * bVar230 | (bVar118 >= bVar230) * bVar118;
  bVar243 = (bVar119 < bVar112) * bVar112 | (bVar119 >= bVar112) * bVar119;
  bVar244 = (bVar120 < bVar216) * bVar216 | (bVar120 >= bVar216) * bVar120;
  bVar245 = (bVar121 < bVar222) * bVar222 | (bVar121 >= bVar222) * bVar121;
  bVar246 = (bVar248 < bVar118) * bVar118 | (bVar248 >= bVar118) * bVar248;
  bVar247 = (bVar250 < bVar119) * bVar119 | (bVar250 >= bVar119) * bVar250;
  bVar249 = (bVar252 < bVar120) * bVar120 | (bVar252 >= bVar120) * bVar252;
  bVar251 = (bVar254 < bVar121) * bVar121 | (bVar254 >= bVar121) * bVar254;
  bVar248 = (bVar248 != 0) * bVar248;
  bVar250 = (bVar250 != 0) * bVar250;
  bVar252 = (bVar252 != 0) * bVar252;
  bVar254 = (bVar254 != 0) * bVar254;
  bVar228 = *_limit;
  bVar231 = _limit[1];
  bVar236 = _limit[2];
  bVar230 = _limit[3];
  bVar217 = _limit[4];
  bVar104 = _limit[5];
  bVar108 = _limit[6];
  bVar110 = _limit[7];
  bVar112 = _limit[8];
  bVar118 = _limit[9];
  bVar119 = _limit[10];
  bVar120 = _limit[0xb];
  bVar121 = _limit[0xc];
  bVar216 = _limit[0xd];
  bVar222 = _limit[0xe];
  bVar223 = _limit[0xf];
  auVar190._0_4_ =
       CONCAT13(-((byte)((bVar237 < bVar230) * bVar237 | (bVar237 >= bVar230) * bVar230) == bVar237)
                ,CONCAT12(-((byte)((bVar235 < bVar236) * bVar235 | (bVar235 >= bVar236) * bVar236)
                           == bVar235),
                          CONCAT11(-((byte)((bVar229 < bVar231) * bVar229 |
                                           (bVar229 >= bVar231) * bVar231) == bVar229),
                                   -((byte)((bVar227 < bVar228) * bVar227 |
                                           (bVar227 >= bVar228) * bVar228) == bVar227))));
  auVar190[4] = -((byte)((bVar242 < bVar217) * bVar242 | (bVar242 >= bVar217) * bVar217) == bVar242)
  ;
  auVar190[5] = -((byte)((bVar243 < bVar104) * bVar243 | (bVar243 >= bVar104) * bVar104) == bVar243)
  ;
  auVar190[6] = -((byte)((bVar244 < bVar108) * bVar244 | (bVar244 >= bVar108) * bVar108) == bVar244)
  ;
  auVar190[7] = -((byte)((bVar245 < bVar110) * bVar245 | (bVar245 >= bVar110) * bVar110) == bVar245)
  ;
  auVar190[8] = -((byte)((bVar246 < bVar112) * bVar246 | (bVar246 >= bVar112) * bVar112) == bVar246)
  ;
  auVar190[9] = -((byte)((bVar247 < bVar118) * bVar247 | (bVar247 >= bVar118) * bVar118) == bVar247)
  ;
  auVar190[10] = -((byte)((bVar249 < bVar119) * bVar249 | (bVar249 >= bVar119) * bVar119) == bVar249
                  );
  auVar190[0xb] =
       -((byte)((bVar251 < bVar120) * bVar251 | (bVar251 >= bVar120) * bVar120) == bVar251);
  auVar190[0xc] =
       -((byte)((bVar248 < bVar121) * bVar248 | (bVar248 >= bVar121) * bVar121) == bVar248);
  auVar190[0xd] =
       -((byte)((bVar250 < bVar216) * bVar250 | (bVar250 >= bVar216) * bVar216) == bVar250);
  auVar190[0xe] =
       -((byte)((bVar252 < bVar222) * bVar252 | (bVar252 >= bVar222) * bVar222) == bVar252);
  auVar190[0xf] =
       -((byte)((bVar254 < bVar223) * bVar254 | (bVar254 >= bVar223) * bVar223) == bVar254);
  auVar105 = psubusb(auVar307,auVar256);
  auVar130 = psubusb(auVar256,auVar307);
  auVar130 = auVar130 | auVar105;
  auVar105 = psubusb(auVar306,auVar256);
  auVar131 = psubusb(auVar256,auVar306);
  auVar131 = auVar131 | auVar105;
  bVar248 = auVar130[0];
  bVar250 = auVar131[0];
  bVar250 = (bVar250 < bVar248) * bVar248 | (bVar250 >= bVar248) * bVar250;
  bVar248 = auVar130[1];
  bVar252 = auVar131[1];
  bVar252 = (bVar252 < bVar248) * bVar248 | (bVar252 >= bVar248) * bVar252;
  bVar248 = auVar130[2];
  bVar254 = auVar131[2];
  bVar254 = (bVar254 < bVar248) * bVar248 | (bVar254 >= bVar248) * bVar254;
  bVar248 = auVar130[3];
  bVar228 = auVar131[3];
  bVar228 = (bVar228 < bVar248) * bVar248 | (bVar228 >= bVar248) * bVar228;
  bVar248 = auVar130[4];
  bVar231 = auVar131[4];
  bVar231 = (bVar231 < bVar248) * bVar248 | (bVar231 >= bVar248) * bVar231;
  bVar248 = auVar130[5];
  bVar236 = auVar131[5];
  bVar236 = (bVar236 < bVar248) * bVar248 | (bVar236 >= bVar248) * bVar236;
  bVar248 = auVar130[6];
  bVar230 = auVar131[6];
  bVar230 = (bVar230 < bVar248) * bVar248 | (bVar230 >= bVar248) * bVar230;
  bVar248 = auVar130[7];
  bVar217 = auVar131[7];
  bVar217 = (bVar217 < bVar248) * bVar248 | (bVar217 >= bVar248) * bVar217;
  bVar248 = (bVar250 < bVar260) * bVar260 | (bVar250 >= bVar260) * bVar250;
  bVar250 = (bVar252 < bVar262) * bVar262 | (bVar252 >= bVar262) * bVar252;
  bVar252 = (bVar254 < bVar264) * bVar264 | (bVar254 >= bVar264) * bVar254;
  bVar254 = (bVar228 < bVar265) * bVar265 | (bVar228 >= bVar265) * bVar228;
  bVar228 = (bVar231 < bVar267) * bVar267 | (bVar231 >= bVar267) * bVar231;
  bVar231 = (bVar236 < bVar268) * bVar268 | (bVar236 >= bVar268) * bVar236;
  bVar236 = (bVar230 < bVar270) * bVar270 | (bVar230 >= bVar270) * bVar230;
  bVar230 = (bVar217 < bVar271) * bVar271 | (bVar217 >= bVar271) * bVar217;
  bVar248 = (bVar228 < bVar248) * bVar248 | (bVar228 >= bVar248) * bVar228;
  bVar250 = (bVar231 < bVar250) * bVar250 | (bVar231 >= bVar250) * bVar231;
  bVar252 = (bVar236 < bVar252) * bVar252 | (bVar236 >= bVar252) * bVar236;
  bVar254 = (bVar230 < bVar254) * bVar254 | (bVar230 >= bVar254) * bVar230;
  uVar202 = CONCAT13(-((byte)((bVar254 == 0) * bVar254 | bVar254 != 0) == bVar254),
                     CONCAT12(-((byte)((bVar252 == 0) * bVar252 | bVar252 != 0) == bVar252),
                              CONCAT11(-((byte)((bVar250 == 0) * bVar250 | bVar250 != 0) == bVar250)
                                       ,-((byte)((bVar248 == 0) * bVar248 | bVar248 != 0) == bVar248
                                         )))) & auVar190._0_4_;
  auVar221._0_8_ = CONCAT44(uVar202,uVar202);
  auVar221._8_4_ = uVar202;
  auVar221._12_4_ = uVar202;
  cVar109 = (char)uVar202;
  auVar130[0] = -(cVar109 == '\0');
  cVar111 = (char)(uVar202 >> 8);
  auVar130[1] = -(cVar111 == '\0');
  cVar113 = (char)(uVar202 >> 0x10);
  auVar130[2] = -(cVar113 == '\0');
  cVar114 = (char)(uVar202 >> 0x18);
  auVar130[3] = -(cVar114 == '\0');
  auVar130[4] = -(cVar109 == '\0');
  auVar130[5] = -(cVar111 == '\0');
  auVar130[6] = -(cVar113 == '\0');
  auVar130[7] = -(cVar114 == '\0');
  auVar130[8] = -(cVar109 == '\0');
  auVar130[9] = -(cVar111 == '\0');
  auVar130[10] = -(cVar113 == '\0');
  auVar130[0xb] = -(cVar114 == '\0');
  auVar130[0xc] = -(cVar109 == '\0');
  auVar130[0xd] = -(cVar111 == '\0');
  auVar130[0xe] = -(cVar113 == '\0');
  auVar130[0xf] = -(cVar114 == '\0');
  uVar11 = *(undefined4 *)(s + lVar103 * 4);
  auVar258._0_8_ = CONCAT44(uVar11,uVar1);
  auVar258._8_8_ = 0;
  bVar248 = (bVar267 < bVar260) * bVar260 | (bVar267 >= bVar260) * bVar267;
  bVar250 = (bVar268 < bVar262) * bVar262 | (bVar268 >= bVar262) * bVar268;
  bVar252 = (bVar270 < bVar264) * bVar264 | (bVar270 >= bVar264) * bVar270;
  bVar254 = (bVar271 < bVar265) * bVar265 | (bVar271 >= bVar265) * bVar271;
  bVar228 = (bVar273 < bVar267) * bVar267 | (bVar273 >= bVar267) * bVar273;
  bVar231 = (bVar274 < bVar268) * bVar268 | (bVar274 >= bVar268) * bVar274;
  bVar236 = (bVar276 < bVar270) * bVar270 | (bVar276 >= bVar270) * bVar276;
  bVar230 = (bVar12 < bVar271) * bVar271 | (bVar12 >= bVar271) * bVar12;
  uVar202 = CONCAT13(-((byte)((bVar254 < bVar70) * bVar254 | (bVar254 >= bVar70) * bVar70) ==
                      bVar254),
                     CONCAT12(-((byte)((bVar252 < bVar69) * bVar252 | (bVar252 >= bVar69) * bVar69)
                               == bVar252),
                              CONCAT11(-((byte)((bVar250 < bVar68) * bVar250 |
                                               (bVar250 >= bVar68) * bVar68) == bVar250),
                                       -((byte)((bVar248 < bVar67) * bVar248 |
                                               (bVar248 >= bVar67) * bVar67) == bVar248))));
  auVar105 = psubsb(auVar148 ^ _DAT_004c95a0,auVar173 ^ _DAT_004c95a0);
  uVar136 = (undefined4)
            (CONCAT17(-((byte)((bVar230 < bVar74) * bVar230 | (bVar230 >= bVar74) * bVar74) ==
                       bVar230),
                      CONCAT16(-((byte)((bVar236 < bVar73) * bVar236 | (bVar236 >= bVar73) * bVar73)
                                == bVar236),
                               CONCAT15(-((byte)((bVar231 < bVar72) * bVar231 |
                                                (bVar231 >= bVar72) * bVar72) == bVar231),
                                        CONCAT14(-((byte)((bVar228 < bVar71) * bVar228 |
                                                         (bVar228 >= bVar71) * bVar71) == bVar228),
                                                 uVar202)))) >> 0x20);
  auVar204._4_4_ = uVar202;
  auVar204._0_4_ = uVar202;
  auVar204._8_4_ = uVar136;
  auVar204._12_4_ = uVar136;
  uVar136 = *(undefined4 *)(s + lVar103 * 5);
  auVar131 = psubsb(~auVar204 & auVar105 >> 0x20,auVar105);
  auVar131 = psubsb(auVar131,auVar105);
  auVar105 = psubsb(auVar131,auVar105);
  uVar203 = SUB164(auVar105 & auVar190,0);
  uVar207 = SUB164(auVar105 & auVar190,4);
  auVar131._4_4_ = uVar203;
  auVar131._0_4_ = uVar203;
  auVar131._8_4_ = uVar207;
  auVar131._12_4_ = uVar207;
  auVar105 = paddsb(auVar131,_DAT_0050d5c0);
  auVar281._0_8_ = CONCAT44(uVar136,uVar8);
  uVar301 = (undefined1)((uint)uVar136 >> 0x18);
  auVar287._8_6_ = 0;
  auVar287._0_8_ = auVar281._0_8_;
  auVar287[0xe] = uVar301;
  auVar287[0xf] = auVar105[7];
  auVar286._14_2_ = auVar287._14_2_;
  auVar286._8_5_ = 0;
  auVar286._0_8_ = auVar281._0_8_;
  auVar286[0xd] = auVar105[6];
  uVar299 = (undefined1)((uint)uVar136 >> 0x10);
  auVar285._13_3_ = auVar286._13_3_;
  auVar285._8_4_ = 0;
  auVar285._0_8_ = auVar281._0_8_;
  auVar285[0xc] = uVar299;
  auVar284._12_4_ = auVar285._12_4_;
  auVar284._8_3_ = 0;
  auVar284._0_8_ = auVar281._0_8_;
  auVar284[0xb] = auVar105[5];
  uVar298 = (undefined1)((uint)uVar136 >> 8);
  auVar283._11_5_ = auVar284._11_5_;
  auVar283._8_2_ = 0;
  auVar283._0_8_ = auVar281._0_8_;
  auVar283[10] = uVar298;
  auVar282._10_6_ = auVar283._10_6_;
  auVar282[8] = 0;
  auVar282._0_8_ = auVar281._0_8_;
  auVar282[9] = auVar105[4];
  auVar281._9_7_ = auVar282._9_7_;
  auVar281[8] = (char)uVar136;
  auVar280._8_8_ = auVar281._8_8_;
  auVar280[7] = auVar105[3];
  uVar296 = (undefined1)((uint)uVar8 >> 0x18);
  auVar280[6] = uVar296;
  auVar280[5] = auVar105[2];
  uVar294 = (undefined1)((uint)uVar8 >> 0x10);
  auVar280[4] = uVar294;
  auVar280._0_4_ = uVar8;
  auVar279._4_12_ = auVar280._4_12_;
  auVar279[3] = auVar105[1];
  uVar293 = (undefined1)((uint)uVar8 >> 8);
  auVar279[2] = uVar293;
  auVar279[0] = (undefined1)uVar8;
  auVar279[1] = auVar105[0];
  auVar105 = psraw(auVar279,0xb);
  auVar131 = packsswb(auVar105,auVar105);
  auVar106[0] = auVar131[0] + '\x01';
  cVar109 = auVar131[1] + '\x01';
  cVar111 = auVar131[2] + '\x01';
  cVar113 = auVar131[3] + '\x01';
  cVar114 = auVar131[4] + '\x01';
  cVar115 = auVar131[5] + '\x01';
  cVar116 = auVar131[6] + '\x01';
  cVar117 = auVar131[7] + '\x01';
  auVar106._8_8_ =
       (undefined8)
       (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(cVar117,cVar117),cVar116),
                                                     cVar116),cVar115),cVar115),cVar114),
                 CONCAT11(cVar114,cVar117)) >> 8);
  auVar106[7] = cVar113;
  auVar106[6] = cVar113;
  auVar106[5] = cVar111;
  auVar106[4] = cVar111;
  auVar106[3] = cVar109;
  auVar106[2] = cVar109;
  auVar106[1] = auVar106[0];
  auVar105 = psraw(auVar106,9);
  auVar105 = packsswb(auVar105,auVar105);
  uVar202 = auVar105._0_4_ & uVar202;
  auVar289._0_8_ = auVar131._0_8_;
  auVar289._8_4_ = auVar131._4_4_;
  auVar289._12_4_ = uVar202;
  auVar288._8_8_ = auVar289._8_8_;
  auVar288._0_4_ = auVar131._0_4_;
  auVar288._4_4_ = uVar202;
  auVar105 = psubsb(auVar173 ^ _DAT_004c95a0,auVar288);
  auVar290._8_8_ = 0;
  auVar290._0_8_ = auVar288._8_8_;
  auVar131 = paddsb(auVar290,auVar148 ^ _DAT_004c95a0);
  auVar292._0_8_ = auVar131._0_8_;
  auVar292._8_4_ = auVar131._4_4_;
  auVar292._12_4_ = auVar105._4_4_;
  auVar291._8_8_ = auVar292._8_8_;
  auVar291._0_4_ = auVar131._0_4_;
  auVar291._4_4_ = auVar105._0_4_;
  uVar278 = SUB168(auVar291 ^ _DAT_004c95a0,0);
  uVar147 = SUB168(auVar291 ^ _DAT_004c95a0,8);
  if ((ushort)((ushort)(SUB161(auVar130 >> 7,0) & 1) | (ushort)(SUB161(auVar130 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar130 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar130 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar130 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar130 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar130 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar130 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar130 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar130 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar130 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar130 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar130 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar130 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar130 >> 0x77,0) & 1) << 0xe | (ushort)(auVar130[0xf] >> 7) << 0xf
              ) != 0xffff) {
    uVar203 = *(undefined4 *)(s + -(long)(p * 7));
    uVar207 = *(undefined4 *)(s + lVar103 * 6);
    local_118._0_8_ = CONCAT44(uVar207,uVar203);
    local_118._8_8_ = 0;
    auVar13._8_6_ = 0;
    auVar13._0_8_ = auVar256._0_8_;
    auVar13[0xe] = (char)((uint)uVar10 >> 0x18);
    uVar215 = auVar13._13_2_;
    auVar20._8_4_ = 0;
    auVar20._0_8_ = auVar256._0_8_;
    auVar20[0xc] = (char)((uint)uVar10 >> 0x10);
    auVar20._13_2_ = uVar215;
    auVar27._8_4_ = 0;
    auVar27._0_8_ = auVar256._0_8_;
    auVar27._12_3_ = auVar20._12_3_;
    auVar34._8_2_ = 0;
    auVar34._0_8_ = auVar256._0_8_;
    auVar34[10] = (char)((uint)uVar10 >> 8);
    auVar34._11_4_ = auVar27._11_4_;
    auVar41._8_2_ = 0;
    auVar41._0_8_ = auVar256._0_8_;
    auVar41._10_5_ = auVar34._10_5_;
    auVar48[8] = (char)uVar10;
    auVar48._0_8_ = auVar256._0_8_;
    auVar48._9_6_ = auVar41._9_6_;
    auVar76._7_8_ = 0;
    auVar76._0_7_ = auVar48._8_7_;
    Var77 = CONCAT81(SUB158(auVar76 << 0x40,7),(char)((uint)uVar7 >> 0x18));
    auVar94._9_6_ = 0;
    auVar94._0_9_ = Var77;
    auVar55[4] = (char)((uint)uVar7 >> 0x10);
    auVar55._0_4_ = uVar7;
    auVar55._5_10_ = SUB1510(auVar94 << 0x30,5);
    auVar78._11_4_ = 0;
    auVar78._0_11_ = auVar55._4_11_;
    auVar60[2] = (char)((uint)uVar7 >> 8);
    auVar60._0_2_ = (ushort)uVar7;
    auVar60._3_12_ = SUB1512(auVar78 << 0x20,3);
    uVar210 = (ushort)uVar7 & 0xff;
    auVar14._8_6_ = 0;
    auVar14._0_8_ = auVar165._0_8_;
    auVar14[0xe] = (char)((uint)uVar9 >> 0x18);
    uVar139 = auVar14._13_2_;
    auVar21._8_4_ = 0;
    auVar21._0_8_ = auVar165._0_8_;
    auVar21[0xc] = (char)((uint)uVar9 >> 0x10);
    auVar21._13_2_ = uVar139;
    auVar28._8_4_ = 0;
    auVar28._0_8_ = auVar165._0_8_;
    auVar28._12_3_ = auVar21._12_3_;
    auVar35._8_2_ = 0;
    auVar35._0_8_ = auVar165._0_8_;
    auVar35[10] = (char)((uint)uVar9 >> 8);
    auVar35._11_4_ = auVar28._11_4_;
    auVar42._8_2_ = 0;
    auVar42._0_8_ = auVar165._0_8_;
    auVar42._10_5_ = auVar35._10_5_;
    auVar49[8] = (char)uVar9;
    auVar49._0_8_ = auVar165._0_8_;
    auVar49._9_6_ = auVar42._9_6_;
    auVar79._7_8_ = 0;
    auVar79._0_7_ = auVar49._8_7_;
    Var80 = CONCAT81(SUB158(auVar79 << 0x40,7),(char)((uint)uVar6 >> 0x18));
    auVar95._9_6_ = 0;
    auVar95._0_9_ = Var80;
    auVar56[4] = (char)((uint)uVar6 >> 0x10);
    auVar56._0_4_ = uVar6;
    auVar56._5_10_ = SUB1510(auVar95 << 0x30,5);
    auVar81._11_4_ = 0;
    auVar81._0_11_ = auVar56._4_11_;
    auVar61[2] = (char)((uint)uVar6 >> 8);
    auVar61._0_2_ = (ushort)uVar6;
    auVar61._3_12_ = SUB1512(auVar81 << 0x20,3);
    uVar164 = (ushort)uVar6 & 0xff;
    auVar15._8_6_ = 0;
    auVar15._0_8_ = auVar307._0_8_;
    auVar15[0xe] = (char)((uint)uVar5 >> 0x18);
    uVar169 = auVar15._13_2_;
    auVar22._8_4_ = 0;
    auVar22._0_8_ = auVar307._0_8_;
    auVar22[0xc] = (char)((uint)uVar5 >> 0x10);
    auVar22._13_2_ = uVar169;
    auVar29._8_4_ = 0;
    auVar29._0_8_ = auVar307._0_8_;
    auVar29._12_3_ = auVar22._12_3_;
    auVar36._8_2_ = 0;
    auVar36._0_8_ = auVar307._0_8_;
    auVar36[10] = (char)((uint)uVar5 >> 8);
    auVar36._11_4_ = auVar29._11_4_;
    auVar43._8_2_ = 0;
    auVar43._0_8_ = auVar307._0_8_;
    auVar43._10_5_ = auVar36._10_5_;
    auVar50[8] = (char)uVar5;
    auVar50._0_8_ = auVar307._0_8_;
    auVar50._9_6_ = auVar43._9_6_;
    auVar82._7_8_ = 0;
    auVar82._0_7_ = auVar50._8_7_;
    Var83 = CONCAT81(SUB158(auVar82 << 0x40,7),(char)((uint)uVar4 >> 0x18));
    auVar96._9_6_ = 0;
    auVar96._0_9_ = Var83;
    auVar57[4] = (char)((uint)uVar4 >> 0x10);
    auVar57._0_4_ = uVar4;
    auVar57._5_10_ = SUB1510(auVar96 << 0x30,5);
    auVar84._11_4_ = 0;
    auVar84._0_11_ = auVar57._4_11_;
    auVar62[2] = (char)((uint)uVar4 >> 8);
    auVar62._0_2_ = (ushort)uVar4;
    auVar62._3_12_ = SUB1512(auVar84 << 0x20,3);
    uVar167 = (ushort)uVar4 & 0xff;
    auVar16._8_6_ = 0;
    auVar16._0_8_ = auVar306._0_8_;
    auVar16[0xe] = (char)((uint)uVar3 >> 0x18);
    uVar275 = auVar16._13_2_;
    auVar23._8_4_ = 0;
    auVar23._0_8_ = auVar306._0_8_;
    auVar23[0xc] = (char)((uint)uVar3 >> 0x10);
    auVar23._13_2_ = uVar275;
    auVar30._8_4_ = 0;
    auVar30._0_8_ = auVar306._0_8_;
    auVar30._12_3_ = auVar23._12_3_;
    auVar37._8_2_ = 0;
    auVar37._0_8_ = auVar306._0_8_;
    auVar37[10] = (char)((uint)uVar3 >> 8);
    auVar37._11_4_ = auVar30._11_4_;
    auVar44._8_2_ = 0;
    auVar44._0_8_ = auVar306._0_8_;
    auVar44._10_5_ = auVar37._10_5_;
    auVar51[8] = (char)uVar3;
    auVar51._0_8_ = auVar306._0_8_;
    auVar51._9_6_ = auVar44._9_6_;
    auVar85._7_8_ = 0;
    auVar85._0_7_ = auVar51._8_7_;
    Var86 = CONCAT81(SUB158(auVar85 << 0x40,7),(char)((uint)uVar2 >> 0x18));
    auVar97._9_6_ = 0;
    auVar97._0_9_ = Var86;
    auVar58[4] = (char)((uint)uVar2 >> 0x10);
    auVar58._0_4_ = uVar2;
    auVar58._5_10_ = SUB1510(auVar97 << 0x30,5);
    auVar87._11_4_ = 0;
    auVar87._0_11_ = auVar58._4_11_;
    auVar63[2] = (char)((uint)uVar2 >> 8);
    auVar63._0_2_ = (ushort)uVar2;
    auVar63._3_12_ = SUB1512(auVar87 << 0x20,3);
    uVar166 = (ushort)uVar2 & 0xff;
    sVar132 = auVar62._2_2_;
    sVar150 = auVar61._2_2_;
    sVar134 = auVar57._4_2_;
    sVar152 = auVar56._4_2_;
    sVar137 = (short)Var83;
    sVar154 = (short)Var80;
    sVar140 = auVar50._8_2_;
    sVar156 = auVar49._8_2_;
    sVar142 = auVar36._10_2_;
    sVar158 = auVar35._10_2_;
    sVar144 = auVar22._12_2_;
    sVar160 = auVar21._12_2_;
    sVar162 = (uVar139 >> 8) + (uVar169 >> 8);
    sVar146 = uVar164 + uVar167 + uVar210;
    sVar205 = auVar60._2_2_;
    sVar151 = sVar150 + sVar132 + sVar205;
    sVar206 = auVar55._4_2_;
    sVar153 = sVar152 + sVar134 + sVar206;
    sVar208 = (short)Var77;
    sVar155 = sVar154 + sVar137 + sVar208;
    sVar209 = auVar48._8_2_;
    sVar157 = sVar156 + sVar140 + sVar209;
    sVar211 = auVar34._10_2_;
    sVar159 = sVar158 + sVar142 + sVar211;
    sVar213 = auVar20._12_2_;
    sVar161 = sVar160 + sVar144 + sVar213;
    sVar163 = sVar162 + (uVar215 >> 8);
    sVar183 = sVar157 + sVar146 + 4;
    sVar184 = sVar159 + sVar151 + 4;
    sVar185 = sVar161 + sVar153 + 4;
    sVar186 = sVar163 + sVar155 + 4;
    sVar123 = auVar63._2_2_;
    sVar124 = auVar58._4_2_;
    sVar125 = (short)Var86;
    sVar126 = auVar51._8_2_;
    sVar127 = auVar37._10_2_;
    sVar128 = auVar23._12_2_;
    sVar187 = sVar186 - (uVar169 >> 8);
    auVar105 = psubusb(auVar258,auVar256);
    auVar130 = psubusb(auVar256,auVar258);
    auVar130 = auVar130 | auVar105;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = auVar281._0_8_;
    auVar105 = psubusb(auVar75,auVar256);
    auVar131 = psubusb(auVar256,auVar75);
    auVar131 = auVar131 | auVar105;
    bVar248 = auVar130[0];
    bVar250 = auVar131[0];
    bVar250 = (bVar250 < bVar248) * bVar248 | (bVar250 >= bVar248) * bVar250;
    bVar248 = auVar130[1];
    bVar252 = auVar131[1];
    bVar252 = (bVar252 < bVar248) * bVar248 | (bVar252 >= bVar248) * bVar252;
    bVar248 = auVar130[2];
    bVar254 = auVar131[2];
    bVar254 = (bVar254 < bVar248) * bVar248 | (bVar254 >= bVar248) * bVar254;
    bVar248 = auVar130[3];
    bVar228 = auVar131[3];
    bVar230 = (bVar228 < bVar248) * bVar248 | (bVar228 >= bVar248) * bVar228;
    bVar248 = auVar130[4];
    bVar228 = auVar131[4];
    bVar260 = (bVar228 < bVar248) * bVar248 | (bVar228 >= bVar248) * bVar228;
    bVar248 = auVar130[5];
    bVar228 = auVar131[5];
    bVar217 = (bVar228 < bVar248) * bVar248 | (bVar228 >= bVar248) * bVar228;
    bVar248 = auVar130[6];
    bVar228 = auVar131[6];
    bVar262 = (bVar228 < bVar248) * bVar248 | (bVar228 >= bVar248) * bVar228;
    bVar248 = auVar130[7];
    bVar228 = auVar131[7];
    bVar264 = (bVar228 < bVar248) * bVar248 | (bVar228 >= bVar248) * bVar228;
    bVar248 = auVar130[8];
    bVar228 = auVar131[8];
    bVar265 = (bVar228 < bVar248) * bVar248 | (bVar228 >= bVar248) * bVar228;
    bVar248 = auVar130[9];
    bVar228 = auVar131[9];
    bVar267 = (bVar228 < bVar248) * bVar248 | (bVar228 >= bVar248) * bVar228;
    bVar248 = auVar130[10];
    bVar228 = auVar131[10];
    bVar268 = (bVar228 < bVar248) * bVar248 | (bVar228 >= bVar248) * bVar228;
    bVar248 = auVar130[0xb];
    bVar228 = auVar131[0xb];
    bVar270 = (bVar228 < bVar248) * bVar248 | (bVar228 >= bVar248) * bVar228;
    bVar248 = auVar130[0xc];
    bVar228 = auVar131[0xc];
    bVar271 = (bVar228 < bVar248) * bVar248 | (bVar228 >= bVar248) * bVar228;
    bVar248 = auVar130[0xd];
    bVar228 = auVar131[0xd];
    bVar273 = (bVar228 < bVar248) * bVar248 | (bVar228 >= bVar248) * bVar228;
    bVar248 = auVar130[0xe];
    bVar228 = auVar131[0xe];
    bVar231 = auVar131[0xf];
    bVar274 = (bVar228 < bVar248) * bVar248 | (bVar228 >= bVar248) * bVar228;
    bVar248 = auVar130[0xf];
    bVar276 = (bVar231 < bVar248) * bVar248 | (bVar231 >= bVar248) * bVar231;
    auVar105 = psubusb(local_118,auVar256);
    auVar130 = psubusb(auVar256,local_118);
    auVar130 = auVar130 | auVar105;
    bVar248 = auVar130[0];
    bVar228 = (bVar248 < bVar250) * bVar250 | (bVar248 >= bVar250) * bVar248;
    bVar248 = auVar130[1];
    bVar231 = (bVar248 < bVar252) * bVar252 | (bVar248 >= bVar252) * bVar248;
    bVar248 = auVar130[2];
    bVar236 = (bVar248 < bVar254) * bVar254 | (bVar248 >= bVar254) * bVar248;
    bVar248 = auVar130[3];
    bVar230 = (bVar248 < bVar230) * bVar230 | (bVar248 >= bVar230) * bVar248;
    bVar248 = auVar130[4];
    bVar260 = (bVar248 < bVar260) * bVar260 | (bVar248 >= bVar260) * bVar248;
    bVar248 = auVar130[5];
    bVar217 = (bVar248 < bVar217) * bVar217 | (bVar248 >= bVar217) * bVar248;
    bVar248 = auVar130[6];
    bVar262 = (bVar248 < bVar262) * bVar262 | (bVar248 >= bVar262) * bVar248;
    bVar248 = auVar130[7];
    bVar264 = (bVar248 < bVar264) * bVar264 | (bVar248 >= bVar264) * bVar248;
    bVar248 = auVar130[8];
    bVar265 = (bVar248 < bVar265) * bVar265 | (bVar248 >= bVar265) * bVar248;
    bVar248 = auVar130[9];
    bVar267 = (bVar248 < bVar267) * bVar267 | (bVar248 >= bVar267) * bVar248;
    bVar248 = auVar130[10];
    bVar268 = (bVar248 < bVar268) * bVar268 | (bVar248 >= bVar268) * bVar248;
    bVar248 = auVar130[0xb];
    bVar270 = (bVar248 < bVar270) * bVar270 | (bVar248 >= bVar270) * bVar248;
    bVar248 = auVar130[0xc];
    bVar248 = (bVar248 < bVar271) * bVar271 | (bVar248 >= bVar271) * bVar248;
    bVar250 = auVar130[0xd];
    bVar254 = (bVar250 < bVar273) * bVar273 | (bVar250 >= bVar273) * bVar250;
    bVar250 = auVar130[0xe];
    bVar271 = auVar130[0xf];
    bVar252 = (bVar250 < bVar274) * bVar274 | (bVar250 >= bVar274) * bVar250;
    bVar250 = (bVar271 < bVar276) * bVar276 | (bVar271 >= bVar276) * bVar271;
    bVar228 = (bVar260 < bVar228) * bVar228 | (bVar260 >= bVar228) * bVar260;
    bVar231 = (bVar217 < bVar231) * bVar231 | (bVar217 >= bVar231) * bVar217;
    bVar236 = (bVar262 < bVar236) * bVar236 | (bVar262 >= bVar236) * bVar262;
    bVar230 = (bVar264 < bVar230) * bVar230 | (bVar264 >= bVar230) * bVar264;
    bVar260 = (bVar265 < bVar260) * bVar260 | (bVar265 >= bVar260) * bVar265;
    bVar217 = (bVar267 < bVar217) * bVar217 | (bVar267 >= bVar217) * bVar267;
    bVar262 = (bVar268 < bVar262) * bVar262 | (bVar268 >= bVar262) * bVar268;
    bVar264 = (bVar270 < bVar264) * bVar264 | (bVar270 >= bVar264) * bVar270;
    bVar265 = (bVar248 < bVar265) * bVar265 | (bVar248 >= bVar265) * bVar248;
    bVar267 = (bVar254 < bVar267) * bVar267 | (bVar254 >= bVar267) * bVar254;
    bVar268 = (bVar252 < bVar268) * bVar268 | (bVar252 >= bVar268) * bVar252;
    bVar270 = (bVar250 < bVar270) * bVar270 | (bVar250 >= bVar270) * bVar250;
    bVar248 = (bVar248 != 0) * bVar248;
    bVar254 = (bVar254 != 0) * bVar254;
    bVar252 = (bVar252 != 0) * bVar252;
    bVar250 = (bVar250 != 0) * bVar250;
    auVar191[0] = -((byte)((bVar228 == 0) * bVar228 | bVar228 != 0) == bVar228);
    auVar191[1] = -((byte)((bVar231 == 0) * bVar231 | bVar231 != 0) == bVar231);
    auVar191[2] = -((byte)((bVar236 == 0) * bVar236 | bVar236 != 0) == bVar236);
    auVar191[3] = -((byte)((bVar230 == 0) * bVar230 | bVar230 != 0) == bVar230);
    auVar191[4] = -((byte)((bVar260 == 0) * bVar260 | bVar260 != 0) == bVar260);
    auVar191[5] = -((byte)((bVar217 == 0) * bVar217 | bVar217 != 0) == bVar217);
    auVar191[6] = -((byte)((bVar262 == 0) * bVar262 | bVar262 != 0) == bVar262);
    auVar191[7] = -((byte)((bVar264 == 0) * bVar264 | bVar264 != 0) == bVar264);
    auVar191[8] = -((byte)((bVar265 == 0) * bVar265 | bVar265 != 0) == bVar265);
    auVar191[9] = -((byte)((bVar267 == 0) * bVar267 | bVar267 != 0) == bVar267);
    auVar191[10] = -((byte)((bVar268 == 0) * bVar268 | bVar268 != 0) == bVar268);
    auVar191[0xb] = -((byte)((bVar270 == 0) * bVar270 | bVar270 != 0) == bVar270);
    auVar191[0xc] = -((byte)((bVar248 == 0) * bVar248 | bVar248 != 0) == bVar248);
    auVar191[0xd] = -((byte)((bVar254 == 0) * bVar254 | bVar254 != 0) == bVar254);
    auVar191[0xe] = -((byte)((bVar252 == 0) * bVar252 | bVar252 != 0) == bVar252);
    auVar191[0xf] = -((byte)((bVar250 == 0) * bVar250 | bVar250 != 0) == bVar250);
    uVar277 = (ushort)(uVar210 + uVar166 + sVar183) >> 3;
    uVar295 = (ushort)(sVar205 + sVar123 + sVar184) >> 3;
    uVar297 = (ushort)(sVar206 + sVar124 + sVar185) >> 3;
    uVar300 = (ushort)(sVar208 + sVar125 + sVar186) >> 3;
    uVar302 = (ushort)(sVar209 + sVar126 + sVar183) >> 3;
    uVar303 = (ushort)(sVar211 + sVar127 + sVar184) >> 3;
    uVar304 = (ushort)(sVar213 + sVar128 + sVar185) >> 3;
    uVar305 = (ushort)((uVar215 >> 8) + (uVar275 >> 8) + sVar186) >> 3;
    uVar278 = CONCAT17((uVar305 != 0) * (uVar305 < 0x100) * (char)uVar305 - (0xff < uVar305),
                       CONCAT16((uVar304 != 0) * (uVar304 < 0x100) * (char)uVar304 -
                                (0xff < uVar304),
                                CONCAT15((uVar303 != 0) * (uVar303 < 0x100) * (char)uVar303 -
                                         (0xff < uVar303),
                                         CONCAT14((uVar302 != 0) * (uVar302 < 0x100) * (char)uVar302
                                                  - (0xff < uVar302),
                                                  CONCAT13((uVar300 != 0) * (uVar300 < 0x100) *
                                                           (char)uVar300 - (0xff < uVar300),
                                                           CONCAT12((uVar297 != 0) *
                                                                    (uVar297 < 0x100) *
                                                                    (char)uVar297 - (0xff < uVar297)
                                                                    ,CONCAT11((uVar295 != 0) *
                                                                              (uVar295 < 0x100) *
                                                                              (char)uVar295 -
                                                                              (0xff < uVar295),
                                                                              (uVar277 != 0) *
                                                                              (uVar277 < 0x100) *
                                                                              (char)uVar277 -
                                                                              (0xff < uVar277)))))))
                      ) & auVar221._0_8_ | ~auVar221._0_8_ & uVar278;
    uVar277 = (ushort)((sVar183 - sVar140) + uVar166 * 2 + uVar164) >> 3;
    uVar295 = (ushort)((sVar184 - sVar142) + sVar123 * 2 + sVar150) >> 3;
    uVar297 = (ushort)((sVar185 - sVar144) + sVar124 * 2 + sVar152) >> 3;
    uVar300 = (ushort)(sVar187 + sVar125 * 2 + sVar154) >> 3;
    uVar302 = (ushort)((sVar183 - uVar167) + sVar126 * 2 + sVar156) >> 3;
    uVar303 = (ushort)((sVar184 - sVar132) + sVar127 * 2 + sVar158) >> 3;
    uVar304 = (ushort)((sVar185 - sVar134) + sVar128 * 2 + sVar160) >> 3;
    uVar305 = (ushort)((sVar186 - sVar137) + (uVar275 >> 8) * 2 + (uVar139 >> 8)) >> 3;
    uVar147 = CONCAT17((uVar305 != 0) * (uVar305 < 0x100) * (char)uVar305 - (0xff < uVar305),
                       CONCAT16((uVar304 != 0) * (uVar304 < 0x100) * (char)uVar304 -
                                (0xff < uVar304),
                                CONCAT15((uVar303 != 0) * (uVar303 < 0x100) * (char)uVar303 -
                                         (0xff < uVar303),
                                         CONCAT14((uVar302 != 0) * (uVar302 < 0x100) * (char)uVar302
                                                  - (0xff < uVar302),
                                                  CONCAT13((uVar300 != 0) * (uVar300 < 0x100) *
                                                           (char)uVar300 - (0xff < uVar300),
                                                           CONCAT12((uVar297 != 0) *
                                                                    (uVar297 < 0x100) *
                                                                    (char)uVar297 - (0xff < uVar297)
                                                                    ,CONCAT11((uVar295 != 0) *
                                                                              (uVar295 < 0x100) *
                                                                              (char)uVar295 -
                                                                              (0xff < uVar295),
                                                                              (uVar277 != 0) *
                                                                              (uVar277 < 0x100) *
                                                                              (char)uVar277 -
                                                                              (0xff < uVar277)))))))
                      ) & auVar221._0_8_ | ~auVar221._0_8_ & uVar147;
    uVar277 = (ushort)(((uVar166 * 3 + uVar167) - sVar156) + (sVar183 - sVar140)) >> 3;
    uVar295 = (ushort)(((sVar123 * 3 + sVar132) - sVar158) + (sVar184 - sVar142)) >> 3;
    uVar297 = (ushort)(((sVar124 * 3 + sVar134) - sVar160) + (sVar185 - sVar144)) >> 3;
    uVar300 = (ushort)(((sVar125 * 3 + sVar137) - (uVar139 >> 8)) + sVar187) >> 3;
    uVar302 = (ushort)(((sVar126 * 3 + sVar140) - uVar164) + (sVar183 - uVar167)) >> 3;
    uVar303 = (ushort)(((sVar127 * 3 + sVar142) - sVar150) + (sVar184 - sVar132)) >> 3;
    uVar304 = (ushort)(((sVar128 * 3 + sVar144) - sVar152) + (sVar185 - sVar134)) >> 3;
    uVar305 = (ushort)((((uVar275 >> 8) * 3 + (uVar169 >> 8)) - sVar154) + (sVar186 - sVar137)) >> 3
    ;
    auVar191 = auVar191 & auVar221;
    auVar307._0_8_ =
         CONCAT17((uVar305 != 0) * (uVar305 < 0x100) * (char)uVar305 - (0xff < uVar305),
                  CONCAT16((uVar304 != 0) * (uVar304 < 0x100) * (char)uVar304 - (0xff < uVar304),
                           CONCAT15((uVar303 != 0) * (uVar303 < 0x100) * (char)uVar303 -
                                    (0xff < uVar303),
                                    CONCAT14((uVar302 != 0) * (uVar302 < 0x100) * (char)uVar302 -
                                             (0xff < uVar302),
                                             CONCAT13((uVar300 != 0) * (uVar300 < 0x100) *
                                                      (char)uVar300 - (0xff < uVar300),
                                                      CONCAT12((uVar297 != 0) * (uVar297 < 0x100) *
                                                               (char)uVar297 - (0xff < uVar297),
                                                               CONCAT11((uVar295 != 0) *
                                                                        (uVar295 < 0x100) *
                                                                        (char)uVar295 -
                                                                        (0xff < uVar295),
                                                                        (uVar277 != 0) *
                                                                        (uVar277 < 0x100) *
                                                                        (char)uVar277 -
                                                                        (0xff < uVar277)))))))) &
         auVar221._0_8_ | ~auVar221._0_8_ & auVar307._0_8_;
    uVar255 = CONCAT44(auVar191._0_4_,auVar191._0_4_);
    auVar107[0] = -(auVar191[0] == '\0');
    auVar107[1] = -(auVar191[1] == '\0');
    auVar107[2] = -(auVar191[2] == '\0');
    auVar107[3] = -(auVar191[3] == '\0');
    auVar107[4] = -(auVar191[0] == '\0');
    auVar107[5] = -(auVar191[1] == '\0');
    auVar107[6] = -(auVar191[2] == '\0');
    auVar107[7] = -(auVar191[3] == '\0');
    auVar107[8] = -(auVar191[4] == '\0');
    auVar107[9] = -(auVar191[5] == '\0');
    auVar107[10] = -(auVar191[6] == '\0');
    auVar107[0xb] = -(auVar191[7] == '\0');
    auVar107[0xc] = -(auVar191[4] == '\0');
    auVar107[0xd] = -(auVar191[5] == '\0');
    auVar107[0xe] = -(auVar191[6] == '\0');
    auVar107[0xf] = -(auVar191[7] == '\0');
    if ((ushort)((ushort)(SUB161(auVar107 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar107 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar107 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar107 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar107 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar107 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar107 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar107 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar107 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar107 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar107 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar107 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar107 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar107 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar107 >> 0x77,0) & 1) << 0xe |
                (ushort)(auVar107[0xf] >> 7) << 0xf) != 0xffff) {
      auVar17._8_6_ = 0;
      auVar17._0_8_ = local_118._0_8_;
      auVar17[0xe] = (char)((uint)uVar207 >> 0x18);
      auVar24._8_4_ = 0;
      auVar24._0_8_ = local_118._0_8_;
      auVar24[0xc] = (char)((uint)uVar207 >> 0x10);
      auVar24._13_2_ = auVar17._13_2_;
      auVar31._8_4_ = 0;
      auVar31._0_8_ = local_118._0_8_;
      auVar31._12_3_ = auVar24._12_3_;
      auVar38._8_2_ = 0;
      auVar38._0_8_ = local_118._0_8_;
      auVar38[10] = (char)((uint)uVar207 >> 8);
      auVar38._11_4_ = auVar31._11_4_;
      auVar45._8_2_ = 0;
      auVar45._0_8_ = local_118._0_8_;
      auVar45._10_5_ = auVar38._10_5_;
      auVar52[8] = (char)uVar207;
      auVar52._0_8_ = local_118._0_8_;
      auVar52._9_6_ = auVar45._9_6_;
      auVar88._7_8_ = 0;
      auVar88._0_7_ = auVar52._8_7_;
      Var77 = CONCAT81(SUB158(auVar88 << 0x40,7),(char)((uint)uVar203 >> 0x18));
      auVar98._9_6_ = 0;
      auVar98._0_9_ = Var77;
      auVar89._1_10_ = SUB1510(auVar98 << 0x30,5);
      auVar89[0] = (char)((uint)uVar203 >> 0x10);
      auVar99._11_4_ = 0;
      auVar99._0_11_ = auVar89;
      auVar64[2] = (char)((uint)uVar203 >> 8);
      auVar64._0_2_ = (ushort)uVar203;
      auVar64._3_12_ = SUB1512(auVar99 << 0x20,3);
      auVar122._0_2_ = (ushort)uVar203 & 0xff;
      auVar122._2_13_ = auVar64._2_13_;
      auVar122[0xf] = 0;
      local_118._0_8_ = ~uVar255 & auVar258._0_8_;
      auVar18._8_6_ = 0;
      auVar18._0_8_ = auVar258._0_8_;
      auVar18[0xe] = (char)((uint)uVar11 >> 0x18);
      uVar277 = auVar18._13_2_;
      auVar25._8_4_ = 0;
      auVar25._0_8_ = auVar258._0_8_;
      auVar25[0xc] = (char)((uint)uVar11 >> 0x10);
      auVar25._13_2_ = uVar277;
      auVar32._8_4_ = 0;
      auVar32._0_8_ = auVar258._0_8_;
      auVar32._12_3_ = auVar25._12_3_;
      auVar39._8_2_ = 0;
      auVar39._0_8_ = auVar258._0_8_;
      auVar39[10] = (char)((uint)uVar11 >> 8);
      auVar39._11_4_ = auVar32._11_4_;
      auVar46._8_2_ = 0;
      auVar46._0_8_ = auVar258._0_8_;
      auVar46._10_5_ = auVar39._10_5_;
      auVar53[8] = (char)uVar11;
      auVar53._0_8_ = auVar258._0_8_;
      auVar53._9_6_ = auVar46._9_6_;
      auVar90._7_8_ = 0;
      auVar90._0_7_ = auVar53._8_7_;
      Var80 = CONCAT81(SUB158(auVar90 << 0x40,7),(char)((uint)uVar1 >> 0x18));
      auVar100._9_6_ = 0;
      auVar100._0_9_ = Var80;
      auVar59[4] = (char)((uint)uVar1 >> 0x10);
      auVar59._0_4_ = uVar1;
      auVar59._5_10_ = SUB1510(auVar100 << 0x30,5);
      auVar91._11_4_ = 0;
      auVar91._0_11_ = auVar59._4_11_;
      auVar65[2] = (char)((uint)uVar1 >> 8);
      auVar65._0_2_ = (ushort)uVar1;
      auVar65._3_12_ = SUB1512(auVar91 << 0x20,3);
      uVar257 = (ushort)uVar1 & 0xff;
      auVar19._8_6_ = 0;
      auVar19._0_8_ = auVar281._0_8_;
      auVar19[0xe] = uVar301;
      uVar295 = auVar19._13_2_;
      auVar26._8_4_ = 0;
      auVar26._0_8_ = auVar281._0_8_;
      auVar26[0xc] = uVar299;
      auVar26._13_2_ = uVar295;
      auVar33._8_4_ = 0;
      auVar33._0_8_ = auVar281._0_8_;
      auVar33._12_3_ = auVar26._12_3_;
      auVar40._8_2_ = 0;
      auVar40._0_8_ = auVar281._0_8_;
      auVar40[10] = uVar298;
      auVar40._11_4_ = auVar33._11_4_;
      auVar47._8_2_ = 0;
      auVar47._0_8_ = auVar281._0_8_;
      auVar47._10_5_ = auVar40._10_5_;
      auVar54[8] = (char)uVar136;
      auVar54._0_8_ = auVar281._0_8_;
      auVar54._9_6_ = auVar47._9_6_;
      auVar92._7_8_ = 0;
      auVar92._0_7_ = auVar54._8_7_;
      Var83 = CONCAT81(SUB158(auVar92 << 0x40,7),uVar296);
      auVar101._9_6_ = 0;
      auVar101._0_9_ = Var83;
      auVar93._1_10_ = SUB1510(auVar101 << 0x30,5);
      auVar93[0] = uVar294;
      auVar102._11_4_ = 0;
      auVar102._0_11_ = auVar93;
      auVar66[2] = uVar293;
      auVar66._0_2_ = (ushort)uVar8;
      auVar66._3_12_ = SUB1512(auVar102 << 0x20,3);
      uVar304 = (ushort)uVar8 & 0xff;
      local_128 = ~uVar255 & auVar306._0_8_;
      sVar259 = auVar65._2_2_;
      sVar261 = auVar59._4_2_;
      sVar263 = (short)Var80;
      sVar266 = auVar53._8_2_;
      sVar269 = auVar39._10_2_;
      sVar272 = auVar25._12_2_;
      sVar168 = (uVar275 >> 8) + (uVar277 >> 8);
      sVar188 = uVar166 + uVar257 + uVar304;
      sVar133 = auVar66._2_2_;
      sVar192 = sVar123 + sVar259 + sVar133;
      sVar135 = auVar93._0_2_;
      sVar194 = sVar124 + sVar261 + sVar135;
      sVar138 = (short)Var83;
      sVar196 = sVar125 + sVar263 + sVar138;
      sVar141 = auVar54._8_2_;
      sVar198 = sVar126 + sVar266 + sVar141;
      sVar143 = auVar40._10_2_;
      sVar199 = sVar127 + sVar269 + sVar143;
      sVar145 = auVar26._12_2_;
      sVar200 = sVar128 + sVar272 + sVar145;
      sVar201 = sVar168 + (uVar295 >> 8);
      auVar105 = psllw(auVar122,2);
      sVar183 = auVar64._2_2_;
      sVar184 = auVar89._0_2_;
      sVar185 = (short)Var77;
      sVar186 = auVar52._8_2_;
      sVar187 = auVar38._10_2_;
      sVar129 = auVar24._12_2_;
      uVar297 = auVar17._13_2_ >> 8;
      sVar189 = sVar198 + sVar157 + sVar188 + sVar146 + 8;
      sVar193 = sVar199 + sVar159 + sVar192 + sVar151 + 8;
      sVar195 = sVar200 + sVar161 + sVar194 + sVar153 + 8;
      sVar197 = sVar201 + sVar163 + sVar196 + sVar155 + 8;
      sVar238 = sVar197 - (uVar295 >> 8);
      sVar170 = (sVar189 - uVar304) - uVar257;
      sVar174 = (sVar193 - sVar133) - sVar259;
      sVar177 = (sVar195 - sVar135) - sVar261;
      sVar180 = (sVar197 - sVar138) - sVar263;
      sVar218 = (sVar189 - sVar141) - sVar266;
      sVar224 = (sVar193 - sVar143) - sVar269;
      sVar232 = (sVar195 - sVar145) - sVar272;
      sVar239 = sVar238 - (uVar277 >> 8);
      sVar219 = sVar218 - sVar126;
      sVar225 = sVar224 - sVar127;
      sVar233 = sVar232 - sVar128;
      sVar240 = sVar239 - (uVar275 >> 8);
      sVar171 = sVar170 - uVar166;
      sVar175 = sVar174 - sVar123;
      sVar178 = sVar177 - sVar124;
      sVar181 = sVar180 - sVar125;
      sVar220 = sVar219 - sVar140;
      sVar226 = sVar225 - sVar142;
      sVar234 = sVar233 - sVar144;
      sVar241 = sVar240 - (uVar169 >> 8);
      sVar172 = sVar171 - uVar167;
      sVar176 = sVar175 - sVar132;
      sVar179 = sVar178 - sVar134;
      sVar182 = sVar181 - sVar137;
      uVar300 = (ushort)(sVar209 + sVar189 + uVar210 + uVar164 + auVar122._0_2_) >> 4;
      uVar302 = (ushort)(sVar211 + sVar193 + sVar205 + sVar150 + sVar183) >> 4;
      uVar303 = (ushort)(sVar213 + sVar195 + sVar206 + sVar152 + sVar184) >> 4;
      uVar305 = (ushort)((uVar215 >> 8) + sVar197 + sVar208 + sVar154 + sVar185) >> 4;
      uVar210 = (ushort)(sVar189 + uVar210 + sVar209 + sVar156 + sVar186) >> 4;
      uVar212 = (ushort)(sVar193 + sVar205 + sVar211 + sVar158 + sVar187) >> 4;
      uVar214 = (ushort)(sVar195 + sVar206 + sVar213 + sVar160 + sVar129) >> 4;
      uVar215 = (ushort)(sVar197 + sVar208 + (uVar215 >> 8) + (uVar139 >> 8) + uVar297) >> 4;
      uVar278 = CONCAT17((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215),
                         CONCAT16((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 -
                                  (0xff < uVar214),
                                  CONCAT15((uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 -
                                           (0xff < uVar212),
                                           CONCAT14((uVar210 != 0) * (uVar210 < 0x100) *
                                                    (char)uVar210 - (0xff < uVar210),
                                                    CONCAT13((uVar305 != 0) * (uVar305 < 0x100) *
                                                             (char)uVar305 - (0xff < uVar305),
                                                             CONCAT12((uVar303 != 0) *
                                                                      (uVar303 < 0x100) *
                                                                      (char)uVar303 -
                                                                      (0xff < uVar303),
                                                                      CONCAT11((uVar302 != 0) *
                                                                               (uVar302 < 0x100) *
                                                                               (char)uVar302 -
                                                                               (0xff < uVar302),
                                                                               (uVar300 != 0) *
                                                                               (uVar300 < 0x100) *
                                                                               (char)uVar300 -
                                                                               (0xff < uVar300))))))
                                 )) & uVar255 | ~uVar255 & uVar278;
      uVar215 = (ushort)(sVar146 + auVar122._0_2_ * 2 + (sVar189 - sVar141)) >> 4;
      uVar300 = (ushort)(sVar151 + sVar183 * 2 + (sVar193 - sVar143)) >> 4;
      uVar302 = (ushort)(sVar153 + sVar184 * 2 + (sVar195 - sVar145)) >> 4;
      uVar303 = (ushort)(sVar155 + sVar185 * 2 + sVar238) >> 4;
      uVar305 = (ushort)((sVar189 - uVar304) + sVar157 + sVar186 * 2) >> 4;
      uVar210 = (ushort)((sVar193 - sVar133) + sVar159 + sVar187 * 2) >> 4;
      uVar212 = (ushort)((sVar195 - sVar135) + sVar161 + sVar129 * 2) >> 4;
      uVar214 = (ushort)((sVar197 - sVar138) + sVar163 + uVar297 * 2) >> 4;
      uVar147 = CONCAT17((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 - (0xff < uVar214),
                         CONCAT16((uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 -
                                  (0xff < uVar212),
                                  CONCAT15((uVar210 != 0) * (uVar210 < 0x100) * (char)uVar210 -
                                           (0xff < uVar210),
                                           CONCAT14((uVar305 != 0) * (uVar305 < 0x100) *
                                                    (char)uVar305 - (0xff < uVar305),
                                                    CONCAT13((uVar303 != 0) * (uVar303 < 0x100) *
                                                             (char)uVar303 - (0xff < uVar303),
                                                             CONCAT12((uVar302 != 0) *
                                                                      (uVar302 < 0x100) *
                                                                      (char)uVar302 -
                                                                      (0xff < uVar302),
                                                                      CONCAT11((uVar300 != 0) *
                                                                               (uVar300 < 0x100) *
                                                                               (char)uVar300 -
                                                                               (0xff < uVar300),
                                                                               (uVar215 != 0) *
                                                                               (uVar215 < 0x100) *
                                                                               (char)uVar215 -
                                                                               (0xff < uVar215))))))
                                 )) & uVar255 | ~uVar255 & uVar147;
      uVar215 = (ushort)(uVar164 + uVar167 + uVar166 + auVar122._0_2_ * 3 + sVar218) >> 4;
      uVar300 = (ushort)(sVar150 + sVar132 + sVar123 + sVar183 * 3 + sVar224) >> 4;
      uVar302 = (ushort)(sVar152 + sVar134 + sVar124 + sVar184 * 3 + sVar232) >> 4;
      uVar303 = (ushort)(sVar154 + sVar137 + sVar125 + sVar185 * 3 + sVar239) >> 4;
      uVar305 = (ushort)(sVar170 + sVar156 + sVar140 + sVar126 + sVar186 * 3) >> 4;
      uVar210 = (ushort)(sVar174 + sVar158 + sVar142 + sVar127 + sVar187 * 3) >> 4;
      uVar212 = (ushort)(sVar177 + sVar160 + sVar144 + sVar128 + sVar129 * 3) >> 4;
      uVar275 = (ushort)(sVar180 + sVar162 + (uVar275 >> 8) + uVar297 * 3) >> 4;
      auVar307._0_8_ =
           CONCAT17((uVar275 != 0) * (uVar275 < 0x100) * (char)uVar275 - (0xff < uVar275),
                    CONCAT16((uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 - (0xff < uVar212),
                             CONCAT15((uVar210 != 0) * (uVar210 < 0x100) * (char)uVar210 -
                                      (0xff < uVar210),
                                      CONCAT14((uVar305 != 0) * (uVar305 < 0x100) * (char)uVar305 -
                                               (0xff < uVar305),
                                               CONCAT13((uVar303 != 0) * (uVar303 < 0x100) *
                                                        (char)uVar303 - (0xff < uVar303),
                                                        CONCAT12((uVar302 != 0) * (uVar302 < 0x100)
                                                                 * (char)uVar302 - (0xff < uVar302),
                                                                 CONCAT11((uVar300 != 0) *
                                                                          (uVar300 < 0x100) *
                                                                          (char)uVar300 -
                                                                          (0xff < uVar300),
                                                                          (uVar215 != 0) *
                                                                          (uVar215 < 0x100) *
                                                                          (char)uVar215 -
                                                                          (0xff < uVar215)))))))) &
           uVar255 | ~uVar255 & auVar307._0_8_;
      uVar215 = (ushort)(uVar166 + uVar257 + uVar167 + auVar105._0_2_ + sVar219) >> 4;
      uVar275 = (ushort)(sVar123 + sVar259 + sVar132 + auVar105._2_2_ + sVar225) >> 4;
      uVar166 = (ushort)(sVar124 + sVar261 + sVar134 + auVar105._4_2_ + sVar233) >> 4;
      uVar167 = (ushort)(sVar125 + sVar263 + sVar137 + auVar105._6_2_ + sVar240) >> 4;
      uVar300 = (ushort)(sVar171 + sVar126 + sVar266 + sVar140 + auVar105._8_2_) >> 4;
      uVar302 = (ushort)(sVar175 + sVar127 + sVar269 + sVar142 + auVar105._10_2_) >> 4;
      uVar303 = (ushort)(sVar178 + sVar128 + sVar272 + sVar144 + auVar105._12_2_) >> 4;
      uVar169 = (ushort)(sVar181 + sVar168 + (uVar169 >> 8) + auVar105._14_2_) >> 4;
      auVar306._0_8_ =
           CONCAT17((uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169),
                    CONCAT16((uVar303 != 0) * (uVar303 < 0x100) * (char)uVar303 - (0xff < uVar303),
                             CONCAT15((uVar302 != 0) * (uVar302 < 0x100) * (char)uVar302 -
                                      (0xff < uVar302),
                                      CONCAT14((uVar300 != 0) * (uVar300 < 0x100) * (char)uVar300 -
                                               (0xff < uVar300),
                                               CONCAT13((uVar167 != 0) * (uVar167 < 0x100) *
                                                        (char)uVar167 - (0xff < uVar167),
                                                        CONCAT12((uVar166 != 0) * (uVar166 < 0x100)
                                                                 * (char)uVar166 - (0xff < uVar166),
                                                                 CONCAT11((uVar275 != 0) *
                                                                          (uVar275 < 0x100) *
                                                                          (char)uVar275 -
                                                                          (0xff < uVar275),
                                                                          (uVar215 != 0) *
                                                                          (uVar215 < 0x100) *
                                                                          (char)uVar215 -
                                                                          (0xff < uVar215)))))))) &
           uVar255 | local_128;
      uVar215 = (ushort)(auVar105._0_2_ + auVar122._0_2_ + sVar188 + sVar220) >> 4;
      uVar169 = (ushort)(auVar105._2_2_ + sVar183 + sVar192 + sVar226) >> 4;
      uVar275 = (ushort)(auVar105._4_2_ + sVar184 + sVar194 + sVar234) >> 4;
      uVar166 = (ushort)(auVar105._6_2_ + sVar185 + sVar196 + sVar241) >> 4;
      uVar167 = (ushort)(sVar172 + auVar105._8_2_ + sVar186 + sVar198) >> 4;
      uVar300 = (ushort)(sVar176 + auVar105._10_2_ + sVar187 + sVar199) >> 4;
      uVar302 = (ushort)(sVar179 + auVar105._12_2_ + sVar129 + sVar200) >> 4;
      uVar303 = (ushort)(sVar182 + auVar105._14_2_ + uVar297 + sVar201) >> 4;
      auVar258._0_8_ =
           CONCAT17((uVar303 != 0) * (uVar303 < 0x100) * (char)uVar303 - (0xff < uVar303),
                    CONCAT16((uVar302 != 0) * (uVar302 < 0x100) * (char)uVar302 - (0xff < uVar302),
                             CONCAT15((uVar300 != 0) * (uVar300 < 0x100) * (char)uVar300 -
                                      (0xff < uVar300),
                                      CONCAT14((uVar167 != 0) * (uVar167 < 0x100) * (char)uVar167 -
                                               (0xff < uVar167),
                                               CONCAT13((uVar166 != 0) * (uVar166 < 0x100) *
                                                        (char)uVar166 - (0xff < uVar166),
                                                        CONCAT12((uVar275 != 0) * (uVar275 < 0x100)
                                                                 * (char)uVar275 - (0xff < uVar275),
                                                                 CONCAT11((uVar169 != 0) *
                                                                          (uVar169 < 0x100) *
                                                                          (char)uVar169 -
                                                                          (0xff < uVar169),
                                                                          (uVar215 != 0) *
                                                                          (uVar215 < 0x100) *
                                                                          (char)uVar215 -
                                                                          (0xff < uVar215)))))))) &
           uVar255 | local_118._0_8_;
      uVar215 = (ushort)(uVar304 + uVar257 + auVar122._0_2_ * 7 + (sVar220 - sVar156)) >> 4;
      uVar169 = (ushort)(sVar133 + sVar259 + sVar183 * 7 + (sVar226 - sVar158)) >> 4;
      uVar275 = (ushort)(sVar135 + sVar261 + sVar184 * 7 + (sVar234 - sVar160)) >> 4;
      uVar139 = (ushort)(sVar138 + sVar263 + sVar185 * 7 + (sVar241 - (uVar139 >> 8))) >> 4;
      uVar166 = (ushort)(sVar141 + sVar266 + sVar186 * 7 + (sVar172 - uVar164)) >> 4;
      uVar167 = (ushort)(sVar143 + sVar269 + sVar187 * 7 + (sVar176 - sVar150)) >> 4;
      uVar300 = (ushort)(sVar145 + sVar272 + sVar129 * 7 + (sVar179 - sVar152)) >> 4;
      uVar277 = (ushort)((uVar295 >> 8) + (uVar277 >> 8) + uVar297 * 7 + (sVar182 - sVar154)) >> 4;
      auVar281._0_8_ =
           ~uVar255 & auVar281._0_8_ |
           CONCAT17((uVar277 != 0) * (uVar277 < 0x100) * (char)uVar277 - (0xff < uVar277),
                    CONCAT16((uVar300 != 0) * (uVar300 < 0x100) * (char)uVar300 - (0xff < uVar300),
                             CONCAT15((uVar167 != 0) * (uVar167 < 0x100) * (char)uVar167 -
                                      (0xff < uVar167),
                                      CONCAT14((uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 -
                                               (0xff < uVar166),
                                               CONCAT13((uVar139 != 0) * (uVar139 < 0x100) *
                                                        (char)uVar139 - (0xff < uVar139),
                                                        CONCAT12((uVar275 != 0) * (uVar275 < 0x100)
                                                                 * (char)uVar275 - (0xff < uVar275),
                                                                 CONCAT11((uVar169 != 0) *
                                                                          (uVar169 < 0x100) *
                                                                          (char)uVar169 -
                                                                          (0xff < uVar169),
                                                                          (uVar215 != 0) *
                                                                          (uVar215 < 0x100) *
                                                                          (char)uVar215 -
                                                                          (0xff < uVar215)))))))) &
           uVar255;
    }
  }
  *(int *)(s + -lVar103) = (int)uVar278;
  *(int *)s = (int)(uVar278 >> 0x20);
  *(int *)(s + lVar103 * -2) = (int)uVar147;
  *(int *)(s + lVar103) = (int)(uVar147 >> 0x20);
  *(int *)(s + lVar103 * -3) = (int)auVar307._0_8_;
  *(int *)(s + lVar103 * 2) = (int)(auVar307._0_8_ >> 0x20);
  *(int *)(s + lVar103 * -4) = (int)auVar306._0_8_;
  *(int *)(s + lVar103 * 3) = (int)(auVar306._0_8_ >> 0x20);
  *(int *)(s + lVar103 * -5) = (int)auVar258._0_8_;
  *(int *)(s + lVar103 * 4) = (int)(auVar258._0_8_ >> 0x20);
  *(int *)(s + lVar103 * -6) = (int)auVar281._0_8_;
  *(int *)(s + lVar103 * 5) = (int)(auVar281._0_8_ >> 0x20);
  return;
}

Assistant:

void aom_lpf_horizontal_14_sse2(unsigned char *s, int p,
                                const unsigned char *_blimit,
                                const unsigned char *_limit,
                                const unsigned char *_thresh) {
  __m128i q6p6, q5p5, q4p4, q3p3, q2p2, q1p1, q0p0;
  __m128i blimit = _mm_load_si128((const __m128i *)_blimit);
  __m128i limit = _mm_load_si128((const __m128i *)_limit);
  __m128i thresh = _mm_load_si128((const __m128i *)_thresh);

  q4p4 = _mm_unpacklo_epi32(xx_loadl_32(s - 5 * p), xx_loadl_32(s + 4 * p));
  q3p3 = _mm_unpacklo_epi32(xx_loadl_32(s - 4 * p), xx_loadl_32(s + 3 * p));
  q2p2 = _mm_unpacklo_epi32(xx_loadl_32(s - 3 * p), xx_loadl_32(s + 2 * p));
  q1p1 = _mm_unpacklo_epi32(xx_loadl_32(s - 2 * p), xx_loadl_32(s + 1 * p));

  q0p0 = _mm_unpacklo_epi32(xx_loadl_32(s - 1 * p), xx_loadl_32(s - 0 * p));

  q5p5 = _mm_unpacklo_epi32(xx_loadl_32(s - 6 * p), xx_loadl_32(s + 5 * p));

  q6p6 = _mm_unpacklo_epi32(xx_loadl_32(s - 7 * p), xx_loadl_32(s + 6 * p));

  lpf_internal_14_sse2(&q6p6, &q5p5, &q4p4, &q3p3, &q2p2, &q1p1, &q0p0, &blimit,
                       &limit, &thresh);

  store_buffer_horz_8(q0p0, p, 0, s);
  store_buffer_horz_8(q1p1, p, 1, s);
  store_buffer_horz_8(q2p2, p, 2, s);
  store_buffer_horz_8(q3p3, p, 3, s);
  store_buffer_horz_8(q4p4, p, 4, s);
  store_buffer_horz_8(q5p5, p, 5, s);
}